

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

success<toml::basic_value<toml::type_config>_> * __thiscall
toml::ok<toml::basic_value<toml::type_config>>
          (success<toml::basic_value<toml::type_config>_> *__return_storage_ptr__,toml *this,
          basic_value<toml::type_config> *v)

{
  basic_value<toml::type_config> *ctx;
  basic_value<toml::type_config> bStack_d8;
  
  ctx = &bStack_d8;
  basic_value<toml::type_config>::basic_value(&bStack_d8,(basic_value<toml::type_config> *)this);
  basic_value<toml::type_config>::basic_value(&__return_storage_ptr__->value,&bStack_d8);
  basic_value<toml::type_config>::cleanup(&bStack_d8,(EVP_PKEY_CTX *)ctx);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&bStack_d8.comments_);
  detail::region::~region(&bStack_d8.region_);
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}